

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShellIntrinsics.cpp
# Opt level: O0

IntrinsicResult intrinsic_keyAvailable(Context *context,IntrinsicResult *partialResult)

{
  Value local_30;
  IntrinsicResult *partialResult_local;
  Context *context_local;
  
  partialResult_local = partialResult;
  context_local = context;
  MiniScript::KeyAvailable();
  MiniScript::IntrinsicResult::IntrinsicResult((IntrinsicResult *)context,&local_30,true);
  MiniScript::Value::~Value(&local_30);
  return (IntrinsicResult)(IntrinsicResultStorage *)context;
}

Assistant:

static IntrinsicResult intrinsic_keyAvailable(Context *context, IntrinsicResult partialResult) {
	return IntrinsicResult(KeyAvailable());
}